

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void snapshot_concurrent_compaction_test(void)

{
  fdb_status fVar1;
  cb_snapshot_args cb_args;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status s;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int commit_term;
  int n;
  int r;
  int idx;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffc38;
  fdb_file_handle *in_stack_fffffffffffffc40;
  fdb_file_handle *valuelen;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  void *in_stack_fffffffffffffc70;
  fdb_kvs_handle *in_stack_fffffffffffffc78;
  fdb_file_handle *local_278;
  char local_268 [72];
  fdb_kvs_config *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  fdb_kvs_handle **in_stack_fffffffffffffdf0;
  fdb_file_handle *in_stack_fffffffffffffdf8;
  fdb_config *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  fdb_file_handle **in_stack_fffffffffffffe68;
  fdb_file_handle local_168 [2];
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  fdb_kvs_handle *in_stack_ffffffffffffff10;
  uint local_54;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  memset(&stack0xfffffffffffffc58,0,0x18);
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  fdb_kvs_open(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffde0);
  local_54 = 0;
  valuelen = local_278;
  do {
    if (99 < (int)local_54) {
      _snapshot_check(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
      ;
      fVar1 = fdb_compact(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xff1);
        snapshot_concurrent_compaction_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0xff1,"void snapshot_concurrent_compaction_test()");
        }
      }
      fdb_close(in_stack_fffffffffffffc38);
      fdb_shutdown();
      memleak_end();
      if (snapshot_concurrent_compaction_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","snapshot with concurrent compaction test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","snapshot with concurrent compaction test");
      }
      return;
    }
    sprintf((char *)local_168,"key%04d",(ulong)local_54);
    sprintf(local_268,"body%04d_update%d",(ulong)local_54,(ulong)(uint)((int)local_54 / 0x32));
    in_stack_fffffffffffffc40 = local_168;
    in_stack_fffffffffffffc38 = local_278;
    strlen((char *)local_168);
    strlen(local_268);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       (void *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       (size_t)valuelen);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xfe4);
      snapshot_concurrent_compaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xfe4,"void snapshot_concurrent_compaction_test()");
      }
    }
    if (((int)(local_54 + 1) % 0x32 == 0) &&
       (fVar1 = fdb_commit(in_stack_fffffffffffffc38,'\0'), fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xfe7);
      snapshot_concurrent_compaction_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xfe7,"void snapshot_concurrent_compaction_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void snapshot_concurrent_compaction_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, idx, r;
    int n = 100;
    int commit_term = n/2;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_snapshot_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_snapshot_args));
    fconfig.wal_threshold = 128;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = cb_snapshot;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_END;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    cb_args.handle = db;

    // write docs & commit for each n/2 doc updates
    for (i=0;i<n;++i){
        idx = i;
        j = i/commit_term;
        sprintf(keybuf, "key%04d", idx);
        sprintf(bodybuf, "body%04d_update%d", idx, j);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1,
                           bodybuf, strlen(bodybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if ((i+1)%commit_term == 0) {
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }
    cb_args.ndocs = n;
    cb_args.nupdates = 2;
    cb_args.niterations = 10;

    _snapshot_check(db, cb_args.ndocs, cb_args.nupdates);

    s = fdb_compact(dbfile, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("snapshot with concurrent compaction test");
}